

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civil_time_detail.h
# Opt level: O2

bool absl::lts_20250127::time_internal::cctz::detail::operator<
               (civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag> *lhs,
               civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag> *rhs)

{
  char cVar1;
  char cVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  
  lVar3 = (lhs->f_).y;
  lVar4 = (rhs->f_).y;
  bVar5 = true;
  if (lVar4 <= lVar3) {
    if (lVar3 == lVar4) {
      cVar1 = (lhs->f_).m;
      cVar2 = (rhs->f_).m;
      if (cVar1 < cVar2) {
        return true;
      }
      if (cVar1 == cVar2) {
        cVar1 = (lhs->f_).d;
        cVar2 = (rhs->f_).d;
        if (cVar1 < cVar2) {
          return true;
        }
        if (cVar1 == cVar2) {
          cVar1 = (lhs->f_).hh;
          cVar2 = (rhs->f_).hh;
          if (cVar1 < cVar2) {
            return true;
          }
          if (cVar1 == cVar2) {
            cVar1 = (lhs->f_).mm;
            cVar2 = (rhs->f_).mm;
            if (cVar1 < cVar2) {
              return true;
            }
            if (cVar1 == cVar2) {
              return (lhs->f_).ss < (rhs->f_).ss;
            }
          }
        }
      }
    }
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

CONSTEXPR_M int day() const noexcept { return f_.d; }